

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mml.c
# Opt level: O0

int mml_start(uchar *buffer)

{
  uchar *buffer_local;
  
  *buffer = '\x01';
  snd_off = 1;
  snd_wave_flag = 0;
  snd_octave = 4;
  snd_volume = 0xf;
  snd_length = 4;
  snd_tempo = 0x80;
  snd_timebase = 0x3c;
  snd_ticks_h = 0;
  snd_ticks_l = 0;
  return 1;
}

Assistant:

int
mml_start(unsigned char *buffer)
{
	*buffer = SND_OFF;

	snd_off = 1;
	snd_wave_flag = 0;
	snd_octave = 4;
	snd_volume = 15;
	snd_length = 4;
	snd_tempo = 128;
	snd_timebase = 60;
	snd_ticks_h = 0;
	snd_ticks_l = 0;

	/* ok */
	return (1);
}